

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int ref_nonsingle(saucy *s,coloring *c,int *adj,int *edg,int cf)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int size;
  int cb;
  int ret;
  int k;
  int j;
  int i;
  int cf_local;
  int *edg_local;
  int *adj_local;
  coloring *c_local;
  saucy *s_local;
  
  iVar2 = cf + c->clen[cf];
  iVar3 = (iVar2 - cf) + 1;
  if (cf == iVar2) {
    s_local._4_4_ = ref_singleton(s,c,adj,edg,cf);
  }
  else {
    memcpy(s->junk,c->lab + cf,(long)iVar3 << 2);
    for (k = 0; k < iVar3; k = k + 1) {
      iVar1 = s->junk[k];
      for (ret = adj[iVar1]; ret != adj[iVar1 + 1]; ret = ret + 1) {
        data_count(s,c,edg[ret]);
      }
    }
    s_local._4_4_ = refine_cell(s,c,ref_nonsingle_cell);
    for (k = cf; k <= iVar2; k = k + 1) {
      iVar3 = c->lab[k];
      for (ret = adj[iVar3]; ret != adj[iVar3 + 1]; ret = ret + 1) {
        s->ccount[edg[ret]] = 0;
      }
    }
  }
  return s_local._4_4_;
}

Assistant:

static int
ref_nonsingle(struct saucy *s, struct coloring *c,
    const int *adj, const int *edg, int cf)
{
    int i, j, k, ret;
    const int cb = cf + c->clen[cf];
    const int size = cb - cf + 1;

    /* Double check for nonsingles which became singles later */
    if (cf == cb) {
        return ref_singleton(s, c, adj, edg, cf);
    }

    /* Establish connected list */
    memcpy(s->junk, c->lab + cf, size * sizeof(int));
    for (i = 0; i < size; ++i) {
        k = s->junk[i];
        for (j = adj[k]; j != adj[k+1]; ++j) {
            data_count(s, c, edg[j]);
        }
    }

    /* Refine the cells we're connected to */
    ret = refine_cell(s, c, ref_nonsingle_cell);

    /* Clear the counts; use lab because junk was overwritten */
    for (i = cf; i <= cb; ++i) {
        k = c->lab[i];
        for (j = adj[k]; j != adj[k+1]; ++j) {
            s->ccount[edg[j]] = 0;
        }
    }

    return ret;
}